

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

void dmrC_copy_statement(dmr_C *C,statement *src,statement *dst)

{
  statement *psVar1;
  symbol *psVar2;
  undefined1 local_40 [8];
  ptr_list_iter stmtiter__;
  statement *stmt;
  statement *dst_local;
  statement *src_local;
  dmr_C *C_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_40,(ptr_list *)(src->field_2).field_1.expression);
  stmtiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_40);
  while (stmtiter__._16_8_ != 0) {
    psVar1 = copy_one_statement(C,(statement *)stmtiter__._16_8_);
    dmrC_add_statement(C,(statement_list **)&(dst->field_2).field_0,psVar1);
    stmtiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_40);
  }
  psVar1 = copy_one_statement(C,(src->field_2).field_4.args);
  (dst->field_2).field_4.args = psVar1;
  psVar2 = copy_symbol(C,src->pos,(src->field_2).field_2.ret_target);
  (dst->field_2).field_2.ret_target = psVar2;
  (dst->field_2).field_3.if_false = (src->field_2).field_3.if_false;
  return;
}

Assistant:

void dmrC_copy_statement(struct dmr_C *C, struct statement *src, struct statement *dst)
{
	struct statement *stmt;

	FOR_EACH_PTR(src->stmts, stmt) {
		dmrC_add_statement(C, &dst->stmts, copy_one_statement(C, stmt));
	} END_FOR_EACH_PTR(stmt);
	dst->args = copy_one_statement(C, src->args);
	dst->ret = copy_symbol(C, src->pos, src->ret);
	dst->inline_fn = src->inline_fn;
}